

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O2

InOutVariable * inOutObject(InOutVariable *v)

{
  long lVar1;
  InOutVariable *in_RSI;
  BlockVariable *sv;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  undefined1 auVar3 [16];
  QJsonArray arr;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  QJsonValue local_50 [24];
  int *local_38;
  
  local_38 = *(int **)(in_FS_OFFSET + 0x28);
  (v->name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)v);
  QString::fromUtf8<void>((QString *)local_68,&in_RSI->name);
  QJsonValue::QJsonValue(local_50,(QString *)local_68);
  nameKey();
  local_78 = QJsonObject::operator[]((QLatin1String *)v);
  QJsonValueRef::operator=((QJsonValueRef *)local_78,local_50);
  QJsonValue::~QJsonValue(local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  QVar2 = typeStr(in_RSI->type);
  QJsonValue::QJsonValue(local_50,(QLatin1String *)QVar2.m_size);
  typeKey();
  local_68 = QJsonObject::operator[]((QLatin1String *)v);
  QJsonValueRef::operator=((QJsonValueRef *)local_68,local_50);
  QJsonValue::~QJsonValue(local_50);
  addDeco((QJsonObject *)v,in_RSI);
  if ((in_RSI->structMembers).d.size != 0) {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)local_78);
    for (lVar1 = (in_RSI->structMembers).d.size * 0x68; lVar1 != 0; lVar1 = lVar1 + -0x68) {
      blockMemberObject((BlockVariable *)local_68);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)local_68);
      QJsonArray::append((QJsonValue *)local_78);
      QJsonValue::~QJsonValue(local_50);
      QJsonObject::~QJsonObject((QJsonObject *)local_68);
    }
    QJsonValue::QJsonValue(local_50,(QJsonArray *)local_78);
    structMembersKey();
    auVar3 = QJsonObject::operator[]((QLatin1String *)v);
    local_68 = auVar3;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,local_50);
    QJsonValue::~QJsonValue(local_50);
    QJsonArray::~QJsonArray((QJsonArray *)local_78);
  }
  if (*(int **)(in_FS_OFFSET + 0x28) == local_38) {
    return v;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonObject inOutObject(const QShaderDescription::InOutVariable &v)
{
    QJsonObject obj;
    obj[nameKey()] = QString::fromUtf8(v.name);
    obj[typeKey()] = typeStr(v.type);
    addDeco(&obj, v);
    if (!v.structMembers.isEmpty()) {
        QJsonArray arr;
        for (const QShaderDescription::BlockVariable &sv : v.structMembers)
            arr.append(blockMemberObject(sv));
        obj[structMembersKey()] = arr;
    }
    return obj;
}